

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O0

void __thiscall FM::OPNB::DataSave(OPNB *this,OPNBData *data,void *adpcmadata)

{
  void *__dest;
  int local_24;
  int i;
  void *adpcmadata_local;
  OPNBData *data_local;
  OPNB *this_local;
  
  OPNABase::DataSave(&this->super_OPNABase,&data->opnabase);
  if (this->adpcmasize != 0) {
    __dest = malloc((long)this->adpcmasize);
    memcpy(__dest,this->adpcmabuf,(long)this->adpcmasize);
  }
  data->adpcmasize = this->adpcmasize;
  memcpy(data->adpcma,this->adpcma,0xd8);
  data->adpcmatl = this->adpcmatl;
  data->adpcmatvol = this->adpcmatvol;
  data->adpcmakey = this->adpcmakey;
  data->adpcmastep = this->adpcmastep;
  *(undefined8 *)data->adpcmareg = *(undefined8 *)this->adpcmareg;
  *(undefined8 *)(data->adpcmareg + 8) = *(undefined8 *)(this->adpcmareg + 8);
  *(undefined8 *)(data->adpcmareg + 0x10) = *(undefined8 *)(this->adpcmareg + 0x10);
  *(undefined8 *)(data->adpcmareg + 0x18) = *(undefined8 *)(this->adpcmareg + 0x18);
  for (local_24 = 0; local_24 < 6; local_24 = local_24 + 1) {
    Channel4::DataSave((Channel4 *)(this->adpcmareg + (long)local_24 * 0x2e0 + 0x24),
                       data->ch + local_24);
  }
  return;
}

Assistant:

void OPNB::DataSave(struct OPNBData* data, void* adpcmadata) {
	OPNABase::DataSave(&data->opnabase);
	if(adpcmasize) {
		adpcmadata = malloc(adpcmasize);
		memcpy(adpcmadata, adpcmabuf, adpcmasize);
	}
	data->adpcmasize = adpcmasize;
	memcpy(data->adpcma, adpcma, sizeof(ADPCMA) * 6);
	data->adpcmatl = adpcmatl;
	data->adpcmatvol = adpcmatvol;
	data->adpcmakey = adpcmakey;
	data->adpcmastep = adpcmastep;
	memcpy(data->adpcmareg, adpcmareg, 32);
	for(int i = 0; i < 6; i++) {
		ch[i].DataSave(&data->ch[i]);
	}
}